

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void permute(size_t *arr,size_t n)

{
  uint32_t uVar1;
  long in_RSI;
  long in_RDI;
  size_t j;
  size_t tmp;
  size_t i;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 local_18;
  
  for (local_18 = in_RSI + -1; local_18 != 0; local_18 = local_18 + -1) {
    uVar1 = testrand_int((uint32_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    in_stack_ffffffffffffffe0 = *(undefined8 *)(in_RDI + local_18 * 8);
    *(undefined8 *)(in_RDI + local_18 * 8) = *(undefined8 *)(in_RDI + (ulong)uVar1 * 8);
    *(undefined8 *)(in_RDI + (ulong)uVar1 * 8) = in_stack_ffffffffffffffe0;
  }
  return;
}

Assistant:

static void permute(size_t *arr, size_t n) {
    size_t i;
    for (i = n - 1; i >= 1; i--) {
        size_t tmp, j;
        j = testrand_int(i + 1);
        tmp = arr[i];
        arr[i] = arr[j];
        arr[j] = tmp;
    }
}